

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseName(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  byte bVar2;
  byte *name;
  xmlParserErrors code;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  xmlParserInputPtr pxVar6;
  xmlChar *pxVar7;
  xmlChar **ppxVar8;
  long lVar9;
  char *info;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uStack_38;
  
  uVar12 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar12 = 50000;
  }
  pxVar6 = ctxt->input;
  uStack_38 = in_RAX;
  if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar6 = ctxt->input;
  }
  name = pxVar6->cur;
  bVar2 = *name;
  if ((((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) || (bVar2 == 0x5f)) || (bVar2 == 0x3a)) {
    uVar11 = 1;
    while (((bVar2 = name[uVar11], (byte)(bVar2 - 0x30) < 10 ||
            ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
           ((bVar2 - 0x2d < 0x33 && ((0x4000000002003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) != 0))
           ))) {
      uVar11 = uVar11 + 1;
    }
    if ((bVar2 == 0) || ((char)bVar2 < '\0')) goto LAB_00133819;
    if (uVar11 <= uVar12) {
      pxVar7 = xmlDictLookup(ctxt->dict,name,(int)uVar11);
      pxVar6 = ctxt->input;
      pxVar6->cur = name + uVar11;
      piVar1 = &pxVar6->col;
      *piVar1 = *piVar1 + (int)uVar11;
      goto LAB_00133d4d;
    }
  }
  else {
LAB_00133819:
    iVar10 = 10000000;
    if (((uint)ctxt->options >> 0x13 & 1) == 0) {
      iVar10 = 50000;
    }
    uVar3 = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
    if ((ctxt->options & 0x20000) == 0) {
      if ((uVar3 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        return (xmlChar *)0x0;
      }
      if (((0x19 < (uVar3 & 0xffffffdf) - 0x41) && (uVar3 != 0x3a)) && (uVar3 != 0x5f)) {
        auVar15._0_4_ = -(uint)(-0x7fffe380 < (int)(uVar3 - 0x37f ^ 0x80000000));
        auVar15._4_4_ = -(uint)(-0x7ffffee1 < (int)(uVar3 - 0x2070 ^ 0x80000000));
        auVar15._8_4_ = -(uint)(-0x7ffffc11 < (int)(uVar3 - 0x2c00 ^ 0x80000000));
        auVar15._12_4_ = -(uint)(-0x7fff5802 < (int)(uVar3 - 0x3001 ^ 0x80000000));
        auVar13._0_4_ = -(uint)(-0x7fffffea < (int)(uVar3 - 0xc0 ^ 0x80000000));
        auVar13._4_4_ = -(uint)(-0x7fffffe2 < (int)(uVar3 - 0xd8 ^ 0x80000000));
        auVar13._8_4_ = -(uint)(-0x7ffffdf9 < (int)(uVar3 - 0xf8 ^ 0x80000000));
        auVar13._12_4_ = -(uint)(-0x7ffffff3 < (int)(uVar3 - 0x370 ^ 0x80000000));
        auVar13 = packssdw(auVar13,auVar15);
        auVar13 = packsswb(auVar13,auVar13);
        if ((((0xdffff < uVar3 - 0x10000 && 0x20d < uVar3 - 0xfdf0) && 0x4cf < uVar3 - 0xf900) &&
            (uVar3 & 0xfffffffe) != 0x200c) &&
            (byte)(SUB161(auVar13 >> 7,0) & 1 | (SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar13 >> 0x17,0) & 1) << 2 | (SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar13 >> 0x27,0) & 1) << 4 | (SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar13 >> 0x37,0) & 1) << 6 | SUB161(auVar13 >> 0x3f,0) << 7) == 0xff) {
          return (xmlChar *)0x0;
        }
      }
      pxVar6 = ctxt->input;
      pxVar7 = pxVar6->cur;
      if (*pxVar7 == '\n') {
        pxVar6->line = pxVar6->line + 1;
        pxVar6->col = 1;
      }
      else {
        pxVar6->col = pxVar6->col + 1;
      }
      ppxVar8 = &pxVar6->cur;
      uVar3 = uStack_38._4_4_;
      while( true ) {
        *ppxVar8 = pxVar7 + (int)uStack_38._4_4_;
        uVar4 = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
        if ((uVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) break;
        if (((10 < uVar4 - 0x30) && (0x19 < (uVar4 & 0xffffffdf) - 0x41)) &&
           (((0x32 < uVar4 - 0x2d || ((0x4000000000003U >> ((ulong)(uVar4 - 0x2d) & 0x3f) & 1) == 0)
             ) && (uVar4 != 0xb7)))) {
          auVar14._0_4_ = -(uint)(-0x7fffffff < (int)(uVar4 - 0x203f ^ 0x80000000));
          auVar14._4_4_ = -(uint)(-0x7ffffee1 < (int)(uVar4 - 0x2070 ^ 0x80000000));
          auVar14._8_4_ = -(uint)(-0x7ffffc11 < (int)(uVar4 - 0x2c00 ^ 0x80000000));
          auVar14._12_4_ = -(uint)(-0x7fff5802 < (int)(uVar4 - 0x3001 ^ 0x80000000));
          auVar16._0_4_ = -(uint)(-0x7fffffea < (int)(uVar4 - 0xc0 ^ 0x80000000));
          auVar16._4_4_ = -(uint)(-0x7fffffe2 < (int)(uVar4 - 0xd8 ^ 0x80000000));
          auVar16._8_4_ = -(uint)(-0x7ffffd7b < (int)(uVar4 - 0xf8 ^ 0x80000000));
          auVar16._12_4_ = -(uint)(-0x7fffe380 < (int)(uVar4 - 0x37f ^ 0x80000000));
          auVar13 = packssdw(auVar16,auVar14);
          auVar13 = packsswb(auVar13,auVar13);
          if ((bool)(~(((uVar4 - 0x10000 < 0xe0000 || uVar4 - 0xfdf0 < 0x20e) ||
                       uVar4 - 0xf900 < 0x4d0) ||
                      (byte)(SUB161(auVar13 >> 7,0) & 1 | (SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar13 >> 0x37,0) & 1) << 6 | SUB161(auVar13 >> 0x3f,0) << 7)
                      != 0xff) & (uVar4 & 0xfffffffe) != 0x200c)) break;
        }
        uVar4 = uStack_38._4_4_;
        if ((int)(uStack_38._4_4_ ^ 0x7fffffff) < (int)uVar3) {
          uVar4 = 0;
        }
        uVar3 = uVar3 + uVar4;
        pxVar6 = ctxt->input;
        ppxVar8 = &pxVar6->cur;
        pxVar7 = pxVar6->cur;
        if (*pxVar7 == '\n') {
          pxVar6->line = pxVar6->line + 1;
          pxVar6->col = 1;
        }
        else {
          pxVar6->col = pxVar6->col + 1;
        }
      }
    }
    else {
      if ((uVar3 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        return (xmlChar *)0x0;
      }
      if ((int)uVar3 < 0x100) {
        if ((((0x16 < uVar3 - 0xc0 && 0x19 < (uVar3 & 0xffffffdf) - 0x41) &&
             ((int)uVar3 < 0xf8 && 0x1e < uVar3 - 0xd8)) && (uVar3 != 0x5f)) && (uVar3 != 0x3a)) {
          return (xmlChar *)0x0;
        }
      }
      else {
        iVar5 = xmlCharInRange(uVar3,&xmlIsBaseCharGroup);
        if ((iVar5 == 0) && ((8 < uVar3 - 0x3021 && 0x51a5 < uVar3 - 0x4e00) && uVar3 != 0x3007)) {
          return (xmlChar *)0x0;
        }
      }
      pxVar6 = ctxt->input;
      pxVar7 = pxVar6->cur;
      if (*pxVar7 == '\n') {
        pxVar6->line = pxVar6->line + 1;
        pxVar6->col = 1;
      }
      else {
        pxVar6->col = pxVar6->col + 1;
      }
      ppxVar8 = &pxVar6->cur;
      uVar3 = uStack_38._4_4_;
      while( true ) {
        *ppxVar8 = pxVar7 + (int)uStack_38._4_4_;
        uVar4 = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
        if ((uVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) break;
        if ((int)uVar4 < 0x100) {
          if ((((0x16 < uVar4 - 0xc0) && (0x19 < (uVar4 & 0xffffffdf) - 0x41)) && (9 < uVar4 - 0x30)
              ) && (((int)uVar4 < 0xf8 && (0x1e < uVar4 - 0xd8)))) {
LAB_00133c5e:
            if ((0x32 < uVar4 - 0x2d) ||
               ((0x4000000002003U >> ((ulong)(uVar4 - 0x2d) & 0x3f) & 1) == 0)) {
              if ((int)uVar4 < 0x100) {
                uVar4 = (uint)(uVar4 == 0xb7);
              }
              else {
                iVar5 = xmlCharInRange(uVar4,&xmlIsCombiningGroup);
                if (iVar5 != 0) goto LAB_00133c6d;
                uVar4 = xmlCharInRange(uVar4,&xmlIsExtenderGroup);
              }
              if (uVar4 == 0) break;
            }
          }
        }
        else {
          iVar5 = xmlCharInRange(uVar4,&xmlIsBaseCharGroup);
          if (((iVar5 == 0) && ((8 < uVar4 - 0x3021 && 0x51a5 < uVar4 - 0x4e00) && uVar4 != 0x3007))
             && (iVar5 = xmlCharInRange(uVar4,&xmlIsDigitGroup), iVar5 == 0)) goto LAB_00133c5e;
        }
LAB_00133c6d:
        uVar4 = uStack_38._4_4_;
        if ((int)(uStack_38._4_4_ ^ 0x7fffffff) < (int)uVar3) {
          uVar4 = 0;
        }
        uVar3 = uVar3 + uVar4;
        pxVar6 = ctxt->input;
        ppxVar8 = &pxVar6->cur;
        pxVar7 = pxVar6->cur;
        if (*pxVar7 == '\n') {
          pxVar6->line = pxVar6->line + 1;
          pxVar6->col = 1;
        }
        else {
          pxVar6->col = pxVar6->col + 1;
        }
      }
    }
    if ((int)uVar3 <= iVar10) {
      pxVar7 = ctxt->input->cur;
      if ((long)(int)uVar3 <= (long)pxVar7 - (long)ctxt->input->base) {
        if ((*pxVar7 == '\n') && (pxVar7[-1] == '\r')) {
          lVar9 = (long)(int)~uVar3;
        }
        else {
          lVar9 = -(long)(int)uVar3;
        }
        pxVar7 = xmlDictLookup(ctxt->dict,pxVar7 + lVar9,uVar3);
LAB_00133d4d:
        if (pxVar7 == (xmlChar *)0x0) {
          xmlCtxtErrMemory(ctxt);
          return (xmlChar *)0x0;
        }
        return pxVar7;
      }
      info = "unexpected change of input buffer";
      code = XML_ERR_INTERNAL_ERROR;
      goto LAB_00133cf9;
    }
  }
  info = "Name";
  code = XML_ERR_NAME_TOO_LONG;
LAB_00133cf9:
  xmlFatalErr(ctxt,code,info);
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    const xmlChar *ret;
    size_t count = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_TEXT_LENGTH :
                       XML_MAX_NAME_LENGTH;

    GROW;

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_') || (*in == ':')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '-') ||
	       (*in == ':') || (*in == '.'))
	    in++;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if (count > maxLength) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Name");
                return(NULL);
            }
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret == NULL)
	        xmlErrMemory(ctxt);
	    return(ret);
	}
    }
    /* accelerator for special cases */
    return(xmlParseNameComplex(ctxt));
}